

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O1

void do_cmd_explore(command *cmd)

{
  loc grid;
  player_upkeep *ppVar1;
  bool bVar2;
  bool bVar3;
  _Bool _Var4;
  wchar_t wVar5;
  loc lVar6;
  square *psVar7;
  monster *mon;
  char cVar8;
  int y;
  int x;
  char *fmt;
  
  if (player->timed[4] == 0) {
    lVar6.x = (player->grid).x;
    lVar6.y = (player->grid).y;
    _Var4 = square_iswebbed(cave,lVar6);
    if (_Var4) {
      msg("You clear the web.");
      grid.x = (player->grid).x;
      grid.y = (player->grid).y;
      square_destroy_trap(cave,grid);
      player->upkeep->energy_use = (uint)z_info->move_energy;
      return;
    }
    if (0 < cave->height) {
      bVar3 = false;
      bVar2 = false;
      y = 0;
      do {
        if (0 < cave->width) {
          x = 0;
          do {
            lVar6 = (loc)loc(x,y);
            _Var4 = loc_eq((loc_conflict)lVar6,player->grid);
            cVar8 = '\a';
            if (!_Var4) {
              _Var4 = square_isoccupied(cave,lVar6);
              cVar8 = '\0';
              if (_Var4) {
                psVar7 = square(cave,lVar6);
                mon = cave_monster(cave,(int)psVar7->mon);
                _Var4 = monster_is_obvious(mon);
                bVar2 = bVar3;
                if (_Var4) {
                  bVar2 = true;
                }
                cVar8 = _Var4 * '\x05';
                bVar3 = bVar2;
              }
            }
          } while (((cVar8 == '\a') || (cVar8 == '\0')) && (x = x + 1, x < cave->width));
        }
        y = y + 1;
      } while ((y < cave->height) && (!bVar2));
      if (bVar2) {
        fmt = "Something is here.";
        goto LAB_0012f744;
      }
    }
    ppVar1 = player->upkeep;
    if (ppVar1->steps != (int16_t *)0x0) {
      __assert_fail("!player->upkeep->steps",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cmd-cave.c"
                    ,0x61d,"void do_cmd_explore(struct command *)");
    }
    wVar5 = path_nearest_unknown(player,player->grid,&ppVar1->path_dest,&ppVar1->steps);
    ppVar1 = player->upkeep;
    ppVar1->step_count = wVar5;
    if (L'\0' < wVar5) {
      ppVar1->running = wVar5;
      *(byte *)&ppVar1->update = (byte)ppVar1->update | 2;
      run_step(L'\0');
      return;
    }
    fmt = "No apparent path for exploration.";
  }
  else {
    fmt = "You cannot explore while confused.";
  }
LAB_0012f744:
  msg(fmt);
  return;
}

Assistant:

void do_cmd_explore(struct command *cmd)
{
	bool visible_monster = false;
	/* cancel if confused */
	if (player->timed[TMD_CONFUSED]) {
		msg("You cannot explore while confused.");
	   	return;
	}


	/* If we're in a web, deal with that */
	if (square_iswebbed(cave, player->grid)) {
		/* Clear the web, finish turn */
		msg("You clear the web.");
		square_destroy_trap(cave, player->grid);
		player->upkeep->energy_use = z_info->move_energy;
		return;
	}
	

	/* Screen for visible monsters */
	for (int y = 0; y < cave->height && !visible_monster; y++) {
		for (int x = 0; x < cave->width; x++) {
			struct loc grid = loc(x, y);
			
			if (loc_eq(grid, player->grid)) continue;

			if (square_isoccupied(cave, grid)) {
				int m_idx = square(cave, grid)->mon;
				struct monster *mon = cave_monster(cave, m_idx);
				if (monster_is_obvious(mon)) {
					visible_monster = true;
					break; /* only breaks the inner loop */
				}
			}
		}
	}

	if (visible_monster) {
		msg("Something is here.");
		return;
	}

	assert(!player->upkeep->steps);
	player->upkeep->step_count = path_nearest_unknown(player, player->grid,
		&player->upkeep->path_dest, &player->upkeep->steps);
	if (player->upkeep->step_count > 0) {
		player->upkeep->running = player->upkeep->step_count;
		/* Calculate torch radius */
		player->upkeep->update |= (PU_TORCH);
		run_step(0);
		return;
	}

	msg("No apparent path for exploration.");
}